

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O2

void __thiscall absl::Mutex::~Mutex(Mutex *this)

{
  if (((this->mu_).super___atomic_base<long>._M_i & 0x10U) != 0) {
    ForgetSynchEvent(&this->mu_,0x10,0x40);
  }
  ForgetDeadlockInfo(this);
  return;
}

Assistant:

Mutex::~Mutex() {
  intptr_t v = mu_.load(std::memory_order_relaxed);
  if ((v & kMuEvent) != 0 && !DebugOnlyIsExiting()) {
    ForgetSynchEvent(&this->mu_, kMuEvent, kMuSpin);
  }
  if (kDebugMode) {
    this->ForgetDeadlockInfo();
  }
  ABSL_TSAN_MUTEX_DESTROY(this, __tsan_mutex_not_static);
}